

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

optional<unsigned_int> wasm::String::anon_unknown_0::takeWTF8CodePoint(string_view *str)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  sbyte sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  byte bVar11;
  
  uVar7 = str->_M_len;
  if (uVar7 != 0) {
    pbVar10 = (byte *)str->_M_str;
    bVar11 = *pbVar10;
    uVar3 = (ulong)bVar11;
    if (-1 < (char)bVar11) {
      str->_M_len = uVar7 - 1;
      str->_M_str = (char *)(pbVar10 + 1);
      uVar9 = 0;
LAB_00c2dc11:
      uVar6 = 0;
LAB_00c2dc13:
      uVar7 = 0;
      if (uVar9 == uVar6) {
        uVar7 = uVar3;
      }
      uVar3 = (ulong)(uVar9 == uVar6) << 0x20;
      goto LAB_00c2dd4f;
    }
    uVar8 = (uint)bVar11;
    if ((bVar11 & 0xe0) == 0xc0) {
      uVar9 = 1;
      uVar5 = 0x7c0;
      sVar4 = 6;
LAB_00c2dc8b:
      if (uVar9 < uVar7) {
        uVar3 = (ulong)(uVar8 << sVar4 & uVar5);
        iVar2 = (int)uVar9 * 6;
        uVar6 = 0;
        do {
          iVar2 = iVar2 + -6;
          lVar1 = uVar6 + 1;
          bVar11 = pbVar10[lVar1] & 0xc0;
          if (bVar11 != 0x80) break;
          uVar6 = uVar6 + 1;
          uVar3 = (ulong)((uint)uVar3 | (pbVar10[lVar1] & 0x3f) << ((byte)iVar2 & 0x1f));
        } while (uVar9 != uVar6);
        lVar1 = uVar9 + 1;
        if (uVar7 <= uVar9) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     lVar1,uVar7);
        }
        str->_M_len = uVar7 - lVar1;
        str->_M_str = (char *)(pbVar10 + lVar1);
        if (bVar11 != 0x80) goto LAB_00c2dd4b;
        uVar8 = (uint)uVar3;
        if (uVar8 < 0x80) goto LAB_00c2dc11;
        uVar6 = 1;
        if ((0x7ff < uVar8) && (uVar6 = 2, 0xffff < uVar8)) {
          uVar6 = (ulong)(uVar8 < 0x110000) - 1 | 3;
        }
        goto LAB_00c2dc13;
      }
      pbVar10 = pbVar10 + uVar7;
      str->_M_len = 0;
    }
    else {
      if ((uVar8 & 0xfffffff0) == 0xe0) {
        uVar9 = 2;
        uVar5 = 0xf000;
        sVar4 = 0xc;
        goto LAB_00c2dc8b;
      }
      if ((uVar8 & 0xfffffff8) == 0xf0) {
        uVar9 = 3;
        uVar5 = 0x1c0000;
        sVar4 = 0x12;
        goto LAB_00c2dc8b;
      }
      pbVar10 = pbVar10 + 1;
      str->_M_len = uVar7 - 1;
    }
    str->_M_str = (char *)pbVar10;
  }
LAB_00c2dd4b:
  uVar3 = 0;
  uVar7 = 0;
LAB_00c2dd4f:
  return (optional<unsigned_int>)(uVar3 | uVar7);
}

Assistant:

std::optional<uint32_t> takeWTF8CodePoint(std::string_view& str) {
  bool valid = true;

  if (str.size() == 0) {
    return std::nullopt;
  }

  uint8_t leading = str[0];
  size_t trailingBytes;
  // Initialized only to avoid spurious compiler warnings.
  uint32_t u = 0;
  if ((leading & 0b10000000) == 0b00000000) {
    // 0xxxxxxx
    trailingBytes = 0;
    u = leading;
  } else if ((leading & 0b11100000) == 0b11000000) {
    // 110xxxxx 10xxxxxx
    trailingBytes = 1;
    u = (leading & 0b00011111) << 6;
  } else if ((leading & 0b11110000) == 0b11100000) {
    // 1110xxxx 10xxxxxx 10xxxxxx
    trailingBytes = 2;
    u = (leading & 0b00001111) << 12;
  } else if ((leading & 0b11111000) == 0b11110000) {
    // 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
    trailingBytes = 3;
    u = (leading & 0b00000111) << 18;
  } else {
    // Bad WTF-8 leading byte.
    trailingBytes = 0;
    valid = false;
  }

  if (str.size() <= trailingBytes) {
    // Unexpected end of string.
    str = str.substr(str.size());
    return std::nullopt;
  }

  if (valid) {
    for (size_t j = 0; j < trailingBytes; ++j) {
      uint8_t trailing = str[1 + j];
      if ((trailing & 0b11000000) != 0b10000000) {
        // Bad WTF-8 trailing byte.
        valid = false;
        break;
      }
      // Shift 6 bits for every remaining trailing byte after this one.
      u |= (trailing & 0b00111111) << (6 * (trailingBytes - j - 1));
    }
  }

  str = str.substr(1 + trailingBytes);

  if (!valid) {
    return std::nullopt;
  }

  size_t expectedTrailing = u < 0x80       ? 0
                            : u < 0x800    ? 1
                            : u < 0x10000  ? 2
                            : u < 0x110000 ? 3
                                           : -1;
  if (trailingBytes != expectedTrailing) {
    // Overlong encoding or overlarge code point.
    return std::nullopt;
  }

  return u;
}